

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::BuildMaterials(BlenderImporter *this,ConversionData *conv_data)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  MTex *tex;
  size_type __n;
  long lVar4;
  aiMaterial *this_00;
  Material *extraout_RDX;
  Material *extraout_RDX_00;
  Material *mat_00;
  BlenderImporter *pBVar5;
  __shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong __n_00;
  aiMaterial *mout;
  shared_ptr<Assimp::Blender::Material> mat;
  float har;
  ai_real aStack_484;
  float local_480;
  _Map_pointer local_478;
  __shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2> *local_470;
  void *local_468;
  float local_460;
  TempArray<std::vector,_aiMaterial> *local_448;
  __shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2> *local_440;
  aiString name;
  
  pBVar5 = (BlenderImporter *)&conv_data->materials;
  __n = std::
        deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
        ::size(&conv_data->materials_raw);
  local_448 = (TempArray<std::vector,_aiMaterial> *)pBVar5;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)pBVar5,__n);
  BuildDefaultMaterial(pBVar5,conv_data);
  p_Var6 = &((conv_data->materials_raw).
             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>;
  local_470 = &((conv_data->materials_raw).
                super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last)->
               super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>;
  local_478 = (conv_data->materials_raw).
              super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_440 = &((conv_data->materials_raw).
                super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
               super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>;
  while (p_Var6 != local_440) {
    std::__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>,p_Var6
              );
    for (lVar4 = 0x3f; lVar4 != 0x52; lVar4 = lVar4 + 1) {
      *(undefined4 *)(&(conv_data->objects)._M_t._M_impl.field_0x0 + lVar4 * 4) = 0;
    }
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    mout = this_00;
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&local_448->arr,&mout);
    std::__cxx11::string::string
              ((string *)&local_468,
               ((mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->id).name + 2,(allocator *)&har);
    __n_00 = (ulong)(uint)local_460;
    if (((uint)local_460 & 0xfffffc00) != 0) {
      __n_00 = 0x3ff;
    }
    name.length = (ai_uint32)__n_00;
    memcpy(name.data,local_468,__n_00);
    name.data[__n_00] = '\0';
    std::__cxx11::string::~string((string *)&local_468);
    aiMaterial::AddProperty(mout,&name,"?mat.name",0,0);
    local_460 = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->b;
    local_468._0_4_ =
         (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->r;
    local_468._4_4_ =
         (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->g;
    if (((((local_468._0_4_ != 0.0) || (NAN(local_468._0_4_))) || (local_468._4_4_ != 0.0)) ||
        ((NAN(local_468._4_4_) || (local_460 != 0.0)))) || (NAN(local_460))) {
      aiMaterial::AddProperty(mout,(aiColor3D *)&local_468,1,"$clr.diffuse",0,0);
      fVar1 = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->emit;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_480 = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->b * fVar1;
        uVar2 = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->r;
        uVar3 = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->g;
        aStack_484 = fVar1 * (float)uVar3;
        har = fVar1 * (float)uVar2;
        aiMaterial::AddProperty(mout,(aiColor3D *)&har,1,"$clr.emissive",0,0);
      }
    }
    local_460 = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->specb;
    local_468._0_4_ =
         (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         specr;
    local_468._4_4_ =
         (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         specg;
    aiMaterial::AddProperty(mout,(aiColor3D *)&local_468,1,"$clr.specular",0,0);
    if ((mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->har
        != 0) {
      har = (float)(int)(mat.
                         super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->har;
      aiMaterial::AddProperty(mout,&har,1,"$mat.shininess",0,0);
    }
    local_460 = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->ambb;
    local_468._0_4_ =
         (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         ambr;
    local_468._4_4_ =
         (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         ambg;
    aiMaterial::AddProperty(mout,(aiColor3D *)&local_468,1,"$clr.ambient",0,0);
    if (((mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         mode & 0x40000) != 0) {
      har = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            ray_mirror;
      aiMaterial::AddProperty(mout,&har,1,"$mat.reflectivity",0,0);
    }
    local_460 = (mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->mirb;
    local_468 = *(void **)&(mat.
                            super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mirr;
    pBVar5 = (BlenderImporter *)mout;
    aiMaterial::AddProperty(mout,(aiColor3D *)&local_468,1,"$clr.reflective",0,0);
    mat_00 = extraout_RDX;
    for (lVar4 = 0; lVar4 != 0x120; lVar4 = lVar4 + 0x10) {
      tex = *(MTex **)((long)&(mat.
                               super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->mtex[0].
                              super___shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + lVar4);
      if (tex != (MTex *)0x0) {
        ResolveTexture(pBVar5,mout,mat_00,tex,conv_data);
        mat_00 = extraout_RDX_00;
      }
    }
    AddBlendParams(pBVar5,mout,
                   mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var6 = p_Var6 + 1;
    if (p_Var6 == local_470) {
      p_Var6 = &local_478[1]->
                super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>;
      local_478 = local_478 + 1;
      local_470 = p_Var6 + 0x20;
    }
  }
  return;
}

Assistant:

void BlenderImporter::BuildMaterials(ConversionData& conv_data)
{
    conv_data.materials->reserve(conv_data.materials_raw.size());

    BuildDefaultMaterial(conv_data);

    for(std::shared_ptr<Material> mat : conv_data.materials_raw) {

        // reset per material global counters
        for (size_t i = 0; i < sizeof(conv_data.next_texture)/sizeof(conv_data.next_texture[0]);++i) {
            conv_data.next_texture[i] = 0 ;
        }

        aiMaterial* mout = new aiMaterial();
        conv_data.materials->push_back(mout);
        // For any new material field handled here, the default material above must be updated with an appropriate default value.

        // set material name
        aiString name = aiString(mat->id.name+2); // skip over the name prefix 'MA'
        mout->AddProperty(&name,AI_MATKEY_NAME);

        // basic material colors
        aiColor3D col(mat->r,mat->g,mat->b);
        if (mat->r || mat->g || mat->b ) {

            // Usually, zero diffuse color means no diffuse color at all in the equation.
            // So we omit this member to express this intent.
            mout->AddProperty(&col,1,AI_MATKEY_COLOR_DIFFUSE);

            if (mat->emit) {
                aiColor3D emit_col(mat->emit * mat->r, mat->emit * mat->g, mat->emit * mat->b) ;
                mout->AddProperty(&emit_col, 1, AI_MATKEY_COLOR_EMISSIVE) ;
            }
        }

        col = aiColor3D(mat->specr,mat->specg,mat->specb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_SPECULAR);

        // is hardness/shininess set?
        if( mat->har ) {
            const float har = mat->har;
            mout->AddProperty(&har,1,AI_MATKEY_SHININESS);
        }

        col = aiColor3D(mat->ambr,mat->ambg,mat->ambb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_AMBIENT);

        // is mirror enabled?
        if( mat->mode & MA_RAYMIRROR ) {
            const float ray_mirror = mat->ray_mirror;
            mout->AddProperty(&ray_mirror,1,AI_MATKEY_REFLECTIVITY);
        }

        col = aiColor3D(mat->mirr,mat->mirg,mat->mirb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_REFLECTIVE);

        for(size_t i = 0; i < sizeof(mat->mtex) / sizeof(mat->mtex[0]); ++i) {
            if (!mat->mtex[i]) {
                continue;
            }

            ResolveTexture(mout,mat.get(),mat->mtex[i].get(),conv_data);
        }

        AddBlendParams(mout, mat.get());
    }
}